

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::expression_tail
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  element_type *peVar1;
  pointer psVar2;
  pointer pSVar3;
  byte bVar4;
  int iVar5;
  Atom *this_00;
  pointer psVar6;
  ulong uVar7;
  ssize_t sVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  bool local_b1;
  ulong local_98;
  Ptr local_90;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  Ptr local_70;
  ulong local_60;
  uint16_t *local_58;
  string local_50;
  
  uVar9 = (uint)write_index;
  local_58 = extent_index;
  if (this->in_hlp == true) {
    bVar4 = r_code::Atom::getAtomCount();
    local_98 = (ulong)(bVar4 - 1 & 0xffff);
    local_b1 = true;
  }
  else {
    local_b1 = Class::is_pattern(p,this->_metadata);
    local_98 = 0;
  }
  if (((write) && ((this->state).pattern_lvl != 0)) &&
     (bVar4 = r_code::Atom::getAtomCount(), uVar9 < bVar4 + uVar9)) {
    uVar11 = uVar9;
    do {
      r_code::Atom::Wildcard((ushort)&local_50);
      this_00 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),
                           (ulong)(uVar11 & 0xffff));
      r_code::Atom::operator=(this_00,(Atom *)&local_50);
      r_code::Atom::~Atom((Atom *)&local_50);
      uVar11 = uVar11 + 1;
      bVar4 = r_code::Atom::getAtomCount();
    } while ((uVar11 & 0xffff) < bVar4 + uVar9);
  }
  peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar6 = (peVar1->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (peVar1->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = r_code::Atom::getAtomCount();
  if (((long)psVar6 - (long)psVar2 >> 4 == (ulong)bVar4) ||
     (iVar5 = std::__cxx11::string::compare
                        ((char *)&((((node->
                                     super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->args).
                                   super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                                   super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->cmd), iVar5 == 0)) {
    peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar6 = (peVar1->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar15 = (peVar1->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish == psVar6;
    if (!bVar15) {
      local_60 = (ulong)write_index;
      lVar13 = 8;
      lVar10 = 0;
      uVar12 = 0;
      do {
        if (uVar12 == 0 && local_b1 == true) {
          (this->state).pattern_lvl = (this->state).pattern_lvl + 1;
        }
        local_80 = *(undefined8 *)((long)psVar6 + lVar13 + -8);
        local_78 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&(psVar6->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar13);
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_78->_M_use_count = local_78->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_78->_M_use_count = local_78->_M_use_count + 1;
          }
        }
        pSVar3 = (p->things_to_read).
                 super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(p->things_to_read).
                       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 5) *
                -0x5555555555555555;
        if (uVar7 < uVar12 || uVar7 - uVar12 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar12,uVar7);
        }
        sVar8 = read(this,(int)&local_80,(void *)((long)&pSVar3->_read + lVar10),1);
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if ((char)sVar8 == '\0') {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50," error: parsing element in expression","");
          local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          set_error(this,&local_50,&local_90);
          if (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            return bVar15;
          }
          operator_delete(local_50._M_dataplus._M_p);
          return bVar15;
        }
        if ((local_98 == uVar12 & local_b1) == 1) {
          (this->state).pattern_lvl = (this->state).pattern_lvl - 1;
        }
        uVar12 = uVar12 + 1;
        peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        psVar6 = (peVar1->args).
                 super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x10;
        lVar10 = lVar10 + 0x60;
        bVar14 = uVar12 < (ulong)((long)(peVar1->args).
                                        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >>
                                 4);
        bVar15 = !bVar14;
      } while (bVar14);
    }
  }
  else {
    local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar4 = r_code::Atom::getAtomCount();
    peVar1 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    set_arity_error(this,&local_70,(ushort)bVar4,
                    (uint16_t)
                    ((uint)(*(int *)&(peVar1->args).
                                     super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->args).
                                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
    if (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool Compiler::expression_tail(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)  // arity>0.
{
    bool entered_pattern;
    uint16_t pattern_end_index;

    if (in_hlp) {
        entered_pattern = true; //p.is_fact(_metadata);
        pattern_end_index = p.atom.getAtomCount() - 1;
    } else {
        entered_pattern = p.is_pattern(_metadata);
        pattern_end_index = 0;
    }

    if (write && state.pattern_lvl) { // fill up with wildcards that will be overwritten up to ::.
        for (uint16_t j = write_index; j < write_index + p.atom.getAtomCount(); ++j) {
            current_object->code[j] = Atom::Wildcard();
        }
    }

    if (node->args.size() != p.atom.getAtomCount() &&
        node->args[node->args.size() - 1]->cmd != "::") {
        set_arity_error(node, p.atom.getAtomCount(), node->args.size());
        return false;
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        if (entered_pattern && i == 0) { // pattern begin.
            ++state.pattern_lvl;
        }

        if (!read(node->args[i], p.things_to_read.at(i), true, write_index + i, extent_index, write)) {
            set_error(" error: parsing element in expression", node);
            return false;
        }

        if (entered_pattern && i == pattern_end_index) { // pattern end.
            --state.pattern_lvl;
        }
    }

    return true;
}